

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

int Priority(expr_node *node)

{
  long lVar1;
  expr_node *node_local;
  int local_4;
  
  if (node->type == '\x05') {
    lVar1 = (node->value).integer;
    if (lVar1 - 1U < 2) {
      local_4 = 5;
    }
    else if (lVar1 - 3U < 2) {
      local_4 = 4;
    }
    else if (lVar1 == 5) {
      local_4 = 2;
    }
    else {
      local_4 = 3;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Priority(const expr_node& node)
{
    if (node.type == OP) {
    switch (node.value.integer) {
        case PWR:
            return 2;
        
        case MUL:
        case DIV:
            return 4;
        
        case ADD:
        case SUB:
            return 5;
        
        default:
            return 3;
        }
    } else {
        return 1;
    }
}